

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::ensureStackUsed(VM *this,addr_t count)

{
  InvalidMemoryAccess *this_00;
  allocator<char> local_39;
  string local_38;
  addr_t local_14;
  VM *pVStack_10;
  addr_t count_local;
  VM *this_local;
  
  if (this->_sp < this->_bp + count) {
    local_14 = count;
    pVStack_10 = this;
    this_00 = (InvalidMemoryAccess *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"tried to modify important stack info",&local_39);
    InvalidMemoryAccess::InvalidMemoryAccess(this_00,&local_38);
    __cxa_throw(this_00,&InvalidMemoryAccess::typeinfo,InvalidMemoryAccess::~InvalidMemoryAccess);
  }
  return;
}

Assistant:

void VM::ensureStackUsed(addr_t count) {
    if (_bp + count > _sp) {
        throw InvalidMemoryAccess("tried to modify important stack info");
    }
}